

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

string * __thiscall
t_rs_generator::rust_union_field_name_abi_cxx11_
          (string *__return_storage_ptr__,t_rs_generator *this,t_field *tfield)

{
  string *name;
  undefined1 local_40 [8];
  string base_field_name;
  t_field *tfield_local;
  t_rs_generator *this_local;
  
  base_field_name.field_2._8_8_ = tfield;
  name = t_field::get_name_abi_cxx11_(tfield);
  rust_camel_case((string *)local_40,this,name);
  rust_safe_name(__return_storage_ptr__,this,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::rust_union_field_name(t_field* tfield) {
  string base_field_name(rust_camel_case(tfield->get_name()));
  return rust_safe_name(base_field_name);
}